

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_env_infrastructure_reuse.hpp
# Opt level: O2

duration __thiscall
so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::no_lock_holder_t>::
distribute_current_data(stats_controller_t<so_5::details::no_lock_holder_t> *this)

{
  mbox_t *to;
  long lVar1;
  source_t *what;
  long lVar2;
  
  lVar1 = std::chrono::_V2::steady_clock::now();
  to = &this->m_distribution_mbox;
  impl::instantiator_and_sender_base<so_5::stats::messages::distribution_started,_false>::send<>(to)
  ;
  for (what = this->m_head; what != (source_t *)0x0;
      what = stats::repository_t::source_list_next(what)) {
    (**what->_vptr_source_t)(what,to);
  }
  impl::instantiator_and_sender_base<so_5::stats::messages::distribution_finished,_false>::send<>
            (to);
  lVar2 = std::chrono::_V2::steady_clock::now();
  return (duration)(lVar2 - lVar1);
}

Assistant:

std::chrono::steady_clock::duration
		distribute_current_data()
			{
				auto started_at = std::chrono::steady_clock::now();

				send< so_5::stats::messages::distribution_started >(
						m_distribution_mbox );

				auto s = m_head;
				while( s )
					{
						s->distribute( m_distribution_mbox );

						s = source_list_next( *s );
					}

				send< so_5::stats::messages::distribution_finished >(
						m_distribution_mbox );

				return std::chrono::steady_clock::now() - started_at;
			}